

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value __thiscall Json::Value::removeMember(Value *this,char *key)

{
  pointer ppVar1;
  char *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  bool bVar3;
  Value VVar4;
  _Self local_50 [3];
  _Self local_38;
  iterator it;
  CZString actualKey;
  char *key_local;
  Value *this_local;
  Value *old;
  
  bVar3 = true;
  if ((*(ushort *)(key + 8) & 0xff) != 0) {
    bVar3 = (*(ushort *)(key + 8) & 0xff) == 7;
  }
  if (bVar3) {
    if ((*(ushort *)(key + 8) & 0xff) == 0) {
      Value(this,(Value *)null);
      uVar2 = extraout_RDX;
    }
    else {
      CZString::CZString((CZString *)&it,in_RDX,noDuplication);
      local_38._M_node =
           (_Base_ptr)
           std::
           map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
           ::find(*(map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                    **)key,(CZString *)&it);
      local_50[0]._M_node =
           (_Base_ptr)
           std::
           map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
           ::end(*(map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                   **)key);
      bVar3 = std::operator==(&local_38,local_50);
      if (bVar3) {
        Value(this,(Value *)null);
      }
      else {
        ppVar1 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
                 operator->(&local_38);
        Value(this,&ppVar1->second);
        std::
        map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
        ::erase_abi_cxx11_(*(map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                             **)key,(iterator)local_38._M_node);
      }
      CZString::~CZString((CZString *)&it);
      uVar2 = extraout_RDX_00;
    }
    VVar4._8_8_ = uVar2;
    VVar4.value_.map_ = (ObjectValues *)this;
    return VVar4;
  }
  __assert_fail("type_ == nullValue || type_ == objectValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/json/impl/json_value.cpp"
                ,0x3d0,"Value Json::Value::removeMember(const char *)");
}

Assistant:

Value
Value::removeMember ( const char* key )
{
    JSON_ASSERT ( type_ == nullValue  ||  type_ == objectValue );

    if ( type_ == nullValue )
        return null;

    CZString actualKey ( key, CZString::noDuplication );
    ObjectValues::iterator it = value_.map_->find ( actualKey );

    if ( it == value_.map_->end () )
        return null;

    Value old (it->second);
    value_.map_->erase (it);
    return old;
}